

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu_widget.cpp
# Opt level: O2

void __thiscall nesvis::PpuWidget::load_pattern_tables(PpuWidget *this)

{
  int i;
  long lVar1;
  Texture *pTVar2;
  Texture local_50;
  
  pTVar2 = (Texture *)&this->pattern_table_textures_;
  for (lVar1 = 0; lVar1 != 0x100; lVar1 = lVar1 + 1) {
    PpuHelper::get_pattern_table_texture(&local_50,this->ppu_helper_,(uint16_t)lVar1,0,0);
    sf::Texture::operator=(pTVar2,&local_50);
    sf::Texture::~Texture(&local_50);
    pTVar2 = pTVar2 + 1;
  }
  pTVar2 = (Texture *)&(this->pattern_table_textures_).field_0x2800;
  for (lVar1 = 0; lVar1 != 0x100; lVar1 = lVar1 + 1) {
    PpuHelper::get_pattern_table_texture(&local_50,this->ppu_helper_,(uint16_t)lVar1,1,0);
    sf::Texture::operator=(pTVar2,&local_50);
    sf::Texture::~Texture(&local_50);
    pTVar2 = pTVar2 + 1;
  }
  return;
}

Assistant:

void PpuWidget::load_pattern_tables() {
    const uint16_t palette = 0; // TODO(jn) update to correct index
    for (int i = 0; i < kPatternTableSize; ++i) {
        pattern_table_textures_[i] =
                ppu_helper_->get_pattern_table_texture(i, 0, palette);
    }

    for (int i = 0; i < kPatternTableSize; ++i) {
        pattern_table_textures_[kPatternTableSize + i] =
                ppu_helper_->get_pattern_table_texture(i, 1, palette);
    }
}